

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist.cpp
# Opt level: O0

void InsertAfter(LinkedList *L,ElementType item)

{
  Node *local_20;
  Node *newNode;
  ElementType item_local;
  LinkedList *L_local;
  
  if (L->size == 0) {
    local_20 = GetNode(item,(Node *)0x0);
    L->front = local_20;
    L->rear = local_20;
    L->position = 0;
  }
  else if ((L->currPtr == (Node *)0x0) || (L->currPtr == L->rear)) {
    local_20 = GetNode(item,(Node *)0x0);
    InsertAfter(L->rear,local_20);
    L->prevPtr = L->rear;
    L->rear = local_20;
    L->position = L->size;
  }
  else {
    local_20 = GetNode(item,L->currPtr->next);
    InsertAfter(L->currPtr,local_20);
    L->prevPtr = L->currPtr;
    L->position = L->position + 1;
  }
  L->size = L->size + 1;
  L->currPtr = local_20;
  return;
}

Assistant:

void InsertAfter(LinkedList *L, ElementType item) {  //链表中在当前结点后插入新结点的函数
    Node *newNode;
    if(!L->size) {
        newNode = GetNode(item,NULL); //在空表中插入
        L->front = newNode;
        L->rear = newNode;
        L->position = 0;
    } else if(!L->currPtr || L->currPtr==L->rear) {
        newNode = GetNode(item,NULL);  //在表头结点插入
        InsertAfter(L->rear,newNode);
        L->prevPtr = L->rear;
        L->rear = newNode;
        L->position = L->size;
    } else {
        newNode = GetNode(item,(L->currPtr)->next);  //在链表中间插入
        InsertAfter(L->currPtr,newNode);
        L->prevPtr = L->currPtr;
        L->position++;
    }
    L->size++;   //增加链表的大小
    L->currPtr = newNode;   //新插入的结点作为当前结点
}